

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  string *config;
  pointer pbVar1;
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  bool bVar3;
  LinkClosure *pLVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  char *val;
  cmLinkLineComputer *linkLineComputer;
  undefined7 in_register_00000031;
  cmOutputConverter *outputConverter;
  string linkLanguage;
  string cuda_lang;
  string linkRuleVar;
  string extraFlags;
  string sStack_c8;
  cmStateDirectory local_a8;
  string local_80;
  string local_60;
  cmStateSnapshot local_40;
  
  if ((int)CONCAT71(in_register_00000031,relink) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"CUDA",(allocator<char> *)&sStack_c8);
    pLVar4 = cmGeneratorTarget::GetLinkClosure
                       ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget,
                        &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                         ConfigName);
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((pLVar4->Languages).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pLVar4->Languages).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_a8);
    pbVar1 = (pLVar4->Languages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_c8,"CUDA_RESOLVE_DEVICE_SYMBOLS",(allocator<char> *)&local_80);
    val = cmGeneratorTarget::GetProperty(this_00,&sStack_c8);
    std::__cxx11::string::~string((string *)&sStack_c8);
    if (val == (char *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = cmSystemTools::IsOn(val);
    }
    if (bVar3 == true && _Var5._M_current != pbVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_c8,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",(allocator<char> *)&local_80)
      ;
      WriteDeviceLibraryRules(this,&sStack_c8,false);
      std::__cxx11::string::~string((string *)&sStack_c8);
    }
    std::__cxx11::string::~string((string *)&local_a8);
  }
  config = &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName;
  cmGeneratorTarget::GetLinkerLanguage
            (&sStack_c8,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_",(allocator<char> *)&local_a8);
  std::__cxx11::string::append((string *)&local_80);
  std::__cxx11::string::append((char *)&local_80);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,&local_60,&sStack_c8);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"CMAKE_MODULE_LINKER_FLAGS",(allocator<char> *)&local_40);
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)pcVar2,&local_60,(string *)&local_a8,config);
  std::__cxx11::string::~string((string *)&local_a8);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  outputConverter =
       &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (pcVar2 == (cmLocalUnixMakefileGenerator3 *)0x0) {
    outputConverter = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot(&local_40,(cmLocalGenerator *)pcVar2);
  cmStateSnapshot::GetDirectory(&local_a8,&local_40);
  linkLineComputer =
       cmMakefileTargetGenerator::CreateLinkLineComputer
                 (&this->super_cmMakefileTargetGenerator,outputConverter,&local_a8);
  cmCommonTargetGenerator::AddModuleDefinitionFlag
            ((cmCommonTargetGenerator *)this,linkLineComputer,&local_60);
  WriteLibraryRules(this,&local_80,&local_60,relink);
  if (linkLineComputer != (cmLinkLineComputer *)0x0) {
    (*linkLineComputer->_vptr_cmLinkLineComputer[1])(linkLineComputer);
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&sStack_c8);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules(bool relink)
{

  if (!relink) {
    const std::string cuda_lang("CUDA");
    cmGeneratorTarget::LinkClosure const* closure =
      this->GeneratorTarget->GetLinkClosure(this->ConfigName);

    const bool hasCUDA =
      (std::find(closure->Languages.begin(), closure->Languages.end(),
                 cuda_lang) != closure->Languages.end());
    bool doDeviceLinking = true;
    if (const char* resolveDeviceSymbols =
          this->GeneratorTarget->GetProperty("CUDA_RESOLVE_DEVICE_SYMBOLS")) {
      doDeviceLinking = cmSystemTools::IsOn(resolveDeviceSymbols);
    }
    if (hasCUDA && doDeviceLinking) {
      std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_LIBRARY";
      this->WriteDeviceLibraryRules(linkRuleVar, relink);
    }
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_CREATE_SHARED_MODULE";

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_MODULE_LINKER_FLAGS", this->ConfigName);

  std::unique_ptr<cmLinkLineComputer> linkLineComputer(
    this->CreateLinkLineComputer(
      this->LocalGenerator,
      this->LocalGenerator->GetStateSnapshot().GetDirectory()));

  this->AddModuleDefinitionFlag(linkLineComputer.get(), extraFlags);

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}